

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O1

size_type __thiscall
itlib::
flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
::erase<Rml::Element*>
          (flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
           *this,Element **k)

{
  Element **__src;
  Element **ppEVar1;
  iterator __dest;
  size_type sVar2;
  
  __dest = find<Rml::Element*>(this,k);
  ppEVar1 = *(Element ***)(this + 8);
  if (__dest._M_current == ppEVar1) {
    sVar2 = 0;
  }
  else {
    __src = __dest._M_current + 1;
    if (__src != ppEVar1) {
      memmove(__dest._M_current,__src,(long)ppEVar1 - (long)__src);
    }
    *(long *)(this + 8) = *(long *)(this + 8) + -8;
    sVar2 = 1;
  }
  return sVar2;
}

Assistant:

size_type erase(const F& k)
    {
        auto i = find(k);
        if (i == end())
        {
            return 0;
        }

        erase(i);
        return 1;
    }